

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O3

Error __thiscall llvm::ErrorList::join(ErrorList *this,Error *E1,Error *E2)

{
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *puVar1;
  const_iterator __position;
  char cVar2;
  ulong uVar3;
  long *plVar4;
  ErrorList *this_00;
  _func_int **pp_Var5;
  ErrorInfoBase *pEVar6;
  pointer *__ptr;
  ErrorInfoBase *pEVar7;
  pointer __p;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> E2Payload;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> _Var8;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *__args;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> Tmp;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> Tmp_2;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> Tmp_1;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> local_48;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> local_40;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> local_38;
  
  uVar3 = (ulong)E1->Payload & 0xfffffffffffffffe;
  E1->Payload = (ErrorInfoBase *)(uVar3 != 0 | uVar3);
  if (uVar3 == 0) {
    (this->super_ErrorInfo<llvm::ErrorList,_llvm::ErrorInfoBase>).super_ErrorInfoBase.
    _vptr_ErrorInfoBase = (_func_int **)((ulong)E2->Payload | 1);
    goto LAB_0018cfe9;
  }
  uVar3 = (ulong)E2->Payload & 0xfffffffffffffffe;
  pEVar7 = (ErrorInfoBase *)(uVar3 != 0 | uVar3);
  E2->Payload = pEVar7;
  pEVar6 = E1->Payload;
  if (uVar3 == 0) goto LAB_0018d0ff;
  plVar4 = (long *)((ulong)pEVar6 & 0xfffffffffffffffe);
  if (plVar4 != (long *)0x0) {
    cVar2 = (**(code **)(*plVar4 + 0x30))(plVar4,&ID);
    pEVar7 = E2->Payload;
    if (cVar2 != '\0') {
      uVar3 = (ulong)E1->Payload & 0xfffffffffffffffe;
      plVar4 = (long *)((ulong)pEVar7 & 0xfffffffffffffffe);
      if (plVar4 == (long *)0x0) {
        _Var8._M_head_impl = (ErrorInfoBase *)0x0;
LAB_0018d0d0:
        E2->Payload = (ErrorInfoBase *)0x0;
        local_48._M_head_impl = _Var8._M_head_impl;
        std::
        vector<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>,std::allocator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>>
        ::
        emplace_back<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>
                  ((vector<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>,std::allocator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>>
                    *)(uVar3 + 8),
                   (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                   &local_48);
        if (local_48._M_head_impl != (ErrorInfoBase *)0x0) {
          pp_Var5 = (local_48._M_head_impl)->_vptr_ErrorInfoBase;
          _Var8._M_head_impl = local_48._M_head_impl;
LAB_0018d0f9:
          (*pp_Var5[1])(_Var8._M_head_impl);
        }
      }
      else {
        cVar2 = (**(code **)(*plVar4 + 0x30))(plVar4,&ID);
        _Var8._M_head_impl = (ErrorInfoBase *)((ulong)E2->Payload & 0xfffffffffffffffe);
        if (cVar2 == '\0') goto LAB_0018d0d0;
        E2->Payload = (ErrorInfoBase *)0x0;
        __args = (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                 _Var8._M_head_impl[1]._vptr_ErrorInfoBase;
        puVar1 = (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                 _Var8._M_head_impl[2]._vptr_ErrorInfoBase;
        if (__args != puVar1) {
          do {
            std::
            vector<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>,std::allocator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>>
            ::
            emplace_back<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>
                      ((vector<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>,std::allocator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>>
                        *)(uVar3 + 8),__args);
            __args = __args + 1;
          } while (__args != puVar1);
        }
        if (_Var8._M_head_impl != (ErrorInfoBase *)0x0) {
          pp_Var5 = (_Var8._M_head_impl)->_vptr_ErrorInfoBase;
          goto LAB_0018d0f9;
        }
      }
      pEVar6 = E1->Payload;
LAB_0018d0ff:
      (this->super_ErrorInfo<llvm::ErrorList,_llvm::ErrorInfoBase>).super_ErrorInfoBase.
      _vptr_ErrorInfoBase = (_func_int **)((ulong)pEVar6 | 1);
      E1->Payload = (ErrorInfoBase *)0x0;
      return (Error)(ErrorInfoBase *)this;
    }
  }
  plVar4 = (long *)((ulong)pEVar7 & 0xfffffffffffffffe);
  if ((plVar4 == (long *)0x0) || (cVar2 = (**(code **)(*plVar4 + 0x30))(plVar4,&ID), cVar2 == '\0'))
  {
    this_00 = (ErrorList *)operator_new(0x20);
    local_38._M_head_impl = (ErrorInfoBase *)((ulong)E1->Payload & 0xfffffffffffffffe);
    E1->Payload = (ErrorInfoBase *)0x0;
    local_40._M_head_impl = (ErrorInfoBase *)((ulong)E2->Payload & 0xfffffffffffffffe);
    E2->Payload = (ErrorInfoBase *)0x0;
    ErrorList(this_00,(unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                      &local_38,
              (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
              &local_40);
    local_48._M_head_impl = (ErrorInfoBase *)0x0;
    (this->super_ErrorInfo<llvm::ErrorList,_llvm::ErrorInfoBase>).super_ErrorInfoBase.
    _vptr_ErrorInfoBase = (_func_int **)((ulong)this_00 | 1);
    std::unique_ptr<llvm::ErrorList,_std::default_delete<llvm::ErrorList>_>::~unique_ptr
              ((unique_ptr<llvm::ErrorList,_std::default_delete<llvm::ErrorList>_> *)&local_48);
    if (local_40._M_head_impl != (ErrorInfoBase *)0x0) {
      (*(local_40._M_head_impl)->_vptr_ErrorInfoBase[1])();
    }
    local_40._M_head_impl = (ErrorInfoBase *)0x0;
    if (local_38._M_head_impl == (ErrorInfoBase *)0x0) {
      return (Error)(ErrorInfoBase *)this;
    }
    (*(local_38._M_head_impl)->_vptr_ErrorInfoBase[1])();
    return (Error)(ErrorInfoBase *)this;
  }
  uVar3 = (ulong)E2->Payload & 0xfffffffffffffffe;
  __position._M_current =
       *(unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> **)(uVar3 + 8);
  local_48._M_head_impl = (ErrorInfoBase *)((ulong)E1->Payload & 0xfffffffffffffffe);
  E1->Payload = (ErrorInfoBase *)0x0;
  std::
  vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
  ::_M_insert_rval((vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
                    *)(uVar3 + 8),__position,(value_type *)&local_48);
  if (local_48._M_head_impl != (ErrorInfoBase *)0x0) {
    (*(local_48._M_head_impl)->_vptr_ErrorInfoBase[1])();
  }
  (this->super_ErrorInfo<llvm::ErrorList,_llvm::ErrorInfoBase>).super_ErrorInfoBase.
  _vptr_ErrorInfoBase = (_func_int **)((ulong)E2->Payload | 1);
LAB_0018cfe9:
  E2->Payload = (ErrorInfoBase *)0x0;
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

static Error join(Error E1, Error E2) {
    if (!E1)
      return E2;
    if (!E2)
      return E1;
    if (E1.isA<ErrorList>()) {
      auto &E1List = static_cast<ErrorList &>(*E1.getPtr());
      if (E2.isA<ErrorList>()) {
        auto E2Payload = E2.takePayload();
        auto &E2List = static_cast<ErrorList &>(*E2Payload);
        for (auto &Payload : E2List.Payloads)
          E1List.Payloads.push_back(std::move(Payload));
      } else
        E1List.Payloads.push_back(E2.takePayload());

      return E1;
    }
    if (E2.isA<ErrorList>()) {
      auto &E2List = static_cast<ErrorList &>(*E2.getPtr());
      E2List.Payloads.insert(E2List.Payloads.begin(), E1.takePayload());
      return E2;
    }
    return Error(std::unique_ptr<ErrorList>(
        new ErrorList(E1.takePayload(), E2.takePayload())));
  }